

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *funcName;
  unsigned_long *puVar2;
  uint64_t uVar3;
  ostream *poVar4;
  result_type seed_00;
  undefined1 local_df8 [8];
  RandEngine nextSeed;
  size_t i;
  anon_class_8_1_9847ac62 aStack_420;
  Fuzzer fuzzer;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_418;
  allocator<char> local_3f1;
  string local_3f0 [39];
  allocator<char> local_3c9;
  string local_3c8 [39];
  allocator<char> local_3a1;
  string local_3a0 [39];
  bool local_379;
  anon_class_8_1_13f31481 aStack_378;
  bool verbose;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_370;
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  functionName;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2a8;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [32];
  undefined1 local_210 [8];
  optional<unsigned_long> latticeElementSeed;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  undefined1 local_160 [8];
  optional<unsigned_long> seed;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  Options local_100 [8];
  Options options;
  allocator<char> local_39;
  string local_38 [8];
  string WasmFuzzTypesOption;
  char **argv_local;
  int argc_local;
  
  WasmFuzzTypesOption.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"wasm-fuzz-lattices options",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"wasm-fuzz-lattices",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,
             "Fuzz lattices for reflexivity, transitivity, and anti-symmetry, and tranfer functions for monotonicity."
             ,(allocator<char> *)
              &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>.field_0xf);
  wasm::Options::Options(local_100,local_120,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"--seed",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"Run a single workload generated by the given seed",&local_1d1);
  latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = local_160;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1f8,
             (anon_class_8_1_89917b6f *)
             &latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  wasm::Options::add((string *)local_100,local_180,local_1a8,local_1d0,(Arguments)local_38,
                     (function *)0x1,SUB81(&local_1f8,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"--lattice-element-seed",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"Seed which generated the lattice elements to be checked.",&local_281);
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = local_210;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_2a8,
             (anon_class_8_1_205b0cb5 *)
             &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  wasm::Options::add((string *)local_100,local_230,local_258,local_280,(Arguments)local_38,
                     (function *)0x1,SUB81(&local_2a8,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2a8);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--function-name",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"Name of the function in the module generated by --seed to be checked.",
             &local_349);
  aStack_378.functionName =
       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )local_2d8;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_370,
             &stack0xfffffffffffffc88);
  wasm::Options::add((string *)local_100,local_2f8,local_320,local_348,(Arguments)local_38,
                     (function *)0x1,SUB81(&local_370,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_370);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_379 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"--verbose",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"-v",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"Print extra information",&local_3f1)
  ;
  aStack_420.verbose = &local_379;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_418,
             &stack0xfffffffffffffbe0);
  wasm::Options::add((string *)local_100,local_3a0,local_3c8,local_3f0,(Arguments)local_38,
                     (function *)0x0,SUB81(&local_418,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_418);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  wasm::Options::parse((int)local_100,(char **)(ulong)(uint)argc);
  wasm::Fuzzer::Fuzzer((Fuzzer *)((long)&i + 7),(bool)(local_379 & 1));
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_160);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_210);
    if ((bVar1) && (bVar1 = std::optional::operator_cast_to_bool((optional *)local_2d8), bVar1)) {
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)local_160);
      uVar3 = *puVar2;
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)local_210);
      funcName = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2d8);
      wasm::Fuzzer::run((Fuzzer *)((long)&i + 7),uVar3,puVar2,funcName);
    }
    else {
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)local_160);
      wasm::Fuzzer::run((Fuzzer *)((long)&i + 7),*puVar2,(uint64_t *)0x0,(string *)0x0);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_2d8);
    wasm::Options::~Options(local_100);
    std::__cxx11::string::~string(local_38);
    return 0;
  }
  nextSeed._M_p = 0;
  uVar3 = wasm::getSeed();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_df8,uVar3);
  do {
    poVar4 = std::operator<<((ostream *)&std::cout,"Iteration ");
    nextSeed._M_p = nextSeed._M_p + 1;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,nextSeed._M_p);
    std::operator<<(poVar4,"\n");
    seed_00 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)local_df8);
    wasm::Fuzzer::run((Fuzzer *)((long)&i + 7),seed_00,(uint64_t *)0x0,(string *)0x0);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-lattices options";

  Options options("wasm-fuzz-lattices",
                  "Fuzz lattices for reflexivity, transitivity, and "
                  "anti-symmetry, and tranfer functions for monotonicity.");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  std::optional<uint64_t> latticeElementSeed;
  options.add("--lattice-element-seed",
              "",
              "Seed which generated the lattice elements to be checked.",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                latticeElementSeed = uint64_t(std::stoull(arg));
              });

  std::optional<std::string> functionName;
  options.add(
    "--function-name",
    "",
    "Name of the function in the module generated by --seed to be checked.",
    WasmFuzzTypesOption,
    Options::Arguments::One,
    [&](Options*, const std::string& arg) { functionName = arg; });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    if (latticeElementSeed && functionName) {
      // Run test a single function and lattice element seed.
      fuzzer.run(*seed, &(*latticeElementSeed), &(*functionName));
    } else {
      // Run just a single workload with the given seed.
      fuzzer.run(*seed);
    }
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}